

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O2

void DrawerCommandQueue::QueueCommand<swrenderer::DrawWallSubClamp1PalCommand>(void)

{
  DrawerCommandQueue *this;
  DrawWallSubClamp1PalCommand *this_00;
  DrawWallSubClamp1PalCommand command;
  
  this = Instance();
  if ((this->threaded_render == 0) || (r_multithreaded.Value == false)) {
    command.super_PalWall1Command._srcblend = (uint32_t *)0x0;
    command.super_PalWall1Command._destblend = (uint32_t *)0x0;
    command.super_PalWall1Command._dest = (uint8_t *)0x0;
    command.super_PalWall1Command._fracbits = 0;
    command.super_PalWall1Command._pitch = 0;
    command.super_PalWall1Command._count = 0;
    command.super_PalWall1Command._36_4_ = 0;
    command.super_PalWall1Command._source = (uint8_t *)0x0;
    command.super_PalWall1Command._texturefrac = 0;
    command.super_PalWall1Command._20_4_ = 0;
    command.super_PalWall1Command._colormap = (uint8_t *)0x0;
    command.super_PalWall1Command.super_DrawerCommand._vptr_DrawerCommand = (_func_int **)0x0;
    command.super_PalWall1Command.super_DrawerCommand._dest_y = 0;
    command.super_PalWall1Command.super_DrawerCommand._12_4_ = 0;
    swrenderer::DrawWallSubClamp1PalCommand::DrawWallSubClamp1PalCommand(&command);
    VectoredTryCatch(&command,QueueCommand<swrenderer::DrawWallSubClamp1PalCommand>::
                              anon_class_1_0_00000001::__invoke,
                     QueueCommand<swrenderer::DrawWallSubClamp1PalCommand>::anon_class_1_0_00000001
                     ::__invoke);
  }
  else {
    this_00 = (DrawWallSubClamp1PalCommand *)AllocMemory(0x50);
    if (this_00 == (DrawWallSubClamp1PalCommand *)0x0) {
      Finish(this);
      this_00 = (DrawWallSubClamp1PalCommand *)AllocMemory(0x50);
      if (this_00 == (DrawWallSubClamp1PalCommand *)0x0) {
        return;
      }
    }
    (this_00->super_PalWall1Command)._srcblend = (uint32_t *)0x0;
    (this_00->super_PalWall1Command)._destblend = (uint32_t *)0x0;
    (this_00->super_PalWall1Command)._dest = (uint8_t *)0x0;
    (this_00->super_PalWall1Command)._fracbits = 0;
    (this_00->super_PalWall1Command)._pitch = 0;
    *(undefined8 *)&(this_00->super_PalWall1Command)._count = 0;
    (this_00->super_PalWall1Command)._source = (uint8_t *)0x0;
    *(undefined8 *)&(this_00->super_PalWall1Command)._texturefrac = 0;
    (this_00->super_PalWall1Command)._colormap = (uint8_t *)0x0;
    (this_00->super_PalWall1Command).super_DrawerCommand._vptr_DrawerCommand = (_func_int **)0x0;
    *(undefined8 *)&(this_00->super_PalWall1Command).super_DrawerCommand._dest_y = 0;
    swrenderer::DrawWallSubClamp1PalCommand::DrawWallSubClamp1PalCommand(this_00);
    command.super_PalWall1Command.super_DrawerCommand._vptr_DrawerCommand = (_func_int **)this_00;
    std::vector<DrawerCommand*,std::allocator<DrawerCommand*>>::emplace_back<DrawerCommand*>
              ((vector<DrawerCommand*,std::allocator<DrawerCommand*>> *)&this->commands,
               (DrawerCommand **)&command);
  }
  return;
}

Assistant:

static void QueueCommand(Types &&... args)
	{
		auto queue = Instance();
		if (queue->threaded_render == 0 || !r_multithreaded)
		{
			T command(std::forward<Types>(args)...);
			VectoredTryCatch(&command,
			[](void *data)
			{
				T *c = (T*)data;
				c->Execute(&Instance()->single_core_thread);
			},
			[](void *data, const char *reason, bool fatal)
			{
				T *c = (T*)data;
				ReportDrawerError(c, false, reason, fatal);
			});
		}
		else
		{
			void *ptr = AllocMemory(sizeof(T));
			if (!ptr) // Out of memory - render what we got
			{
				queue->Finish();
				ptr = AllocMemory(sizeof(T));
				if (!ptr)
					return;
			}
			T *command = new (ptr)T(std::forward<Types>(args)...);
			queue->commands.push_back(command);
		}
	}